

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_round_box.cxx
# Opt level: O3

void fl_round_down_box(int x,int y,int w,int h,Fl_Color bgcolor)

{
  Fl_Color FVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  
  puVar2 = fl_gray_ramp();
  FVar1 = Fl::box_color(bgcolor);
  if (w < 5) {
    uVar3 = (w - (w + -1 >> 0x1f)) - 1;
    iVar7 = (int)uVar3 >> 1;
    uVar3 = uVar3 & 0xfffffffe;
  }
  else {
    iVar7 = 2;
    uVar3 = 4;
  }
  if (h <= (int)uVar3) {
    uVar3 = (h - (h + -1 >> 0x1f)) - 1;
    iVar7 = (int)uVar3 >> 1;
    uVar3 = uVar3 & 0xfffffffe;
  }
  uVar5 = w - uVar3;
  uVar3 = h - uVar3;
  uVar6 = uVar5;
  if (h < w) {
    uVar6 = uVar3;
  }
  if (1 < (int)uVar6) {
    uVar4 = x + iVar7;
    uVar8 = iVar7 + y;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
    iVar7 = -0x5a;
    if (w <= h) {
      iVar7 = 0;
    }
    iVar10 = 0xb4;
    if (h < w) {
      iVar10 = 0x5a;
    }
    iVar9 = 0x168;
    if (h < w) {
      iVar9 = 0x10e;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              ((double)iVar7,fl_graphics_driver,(ulong)((uVar4 + uVar5) - uVar6),(ulong)uVar8,
               (ulong)uVar6,(ulong)uVar6);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              ((double)iVar10,(double)iVar9,fl_graphics_driver,(ulong)uVar4,
               (ulong)((uVar3 + uVar8) - uVar6),(ulong)uVar6,(ulong)uVar6);
    if (w < h) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)uVar4,(ulong)((uVar6 >> 1) + uVar8),(ulong)uVar5,
                 (ulong)(uVar3 - (uVar6 & 0x7ffffffe)));
    }
    else if (h < w) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)((uVar3 >> 1) + uVar4),(ulong)uVar8,
                 (ulong)(uVar5 - (uVar3 & 0x7ffffffe)),(ulong)uVar3);
    }
  }
  iVar7 = x + 1;
  iVar10 = w + -2;
  draw(0,iVar7,y,iVar10,h,0,(uint)puVar2[0x4e]);
  draw(0,iVar7,y,iVar10,h,1,(uint)puVar2[0x48]);
  draw(0,x,y,w,h,0,(uint)puVar2[0x4e]);
  draw(0,x,y,w,h,1,(uint)puVar2[0x48]);
  draw(1,x,y,w,h,0,(uint)puVar2[0x53]);
  draw(1,iVar7,y,iVar10,h,0,(uint)puVar2[0x55]);
  draw(1,x,y,w,h,1,(uint)puVar2[0x55]);
  draw(1,iVar7,y,iVar10,h,1,(uint)puVar2[0x57]);
  draw(2,x,y,w,h,2,(uint)puVar2[0x41]);
  return;
}

Assistant:

void fl_round_down_box(int x, int y, int w, int h, Fl_Color bgcolor) {
  const uchar *g = fl_gray_ramp();
  draw(FILL,	    x,   y, w,   h, 2, Fl::box_color(bgcolor));
  draw(UPPER_LEFT,  x+1, y, w-2, h, 0, (Fl_Color)g[(int)'N']);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 1, (Fl_Color)g[(int)'H']);
  draw(UPPER_LEFT,  x,   y, w,   h, 0, (Fl_Color)g[(int)'N']);
  draw(UPPER_LEFT,  x,   y, w,   h, 1, (Fl_Color)g[(int)'H']);
  draw(LOWER_RIGHT, x,   y, w,   h, 0, (Fl_Color)g[(int)'S']);
  draw(LOWER_RIGHT, x+1, y, w-2, h, 0, (Fl_Color)g[(int)'U']);
  draw(LOWER_RIGHT, x,   y, w,   h, 1, (Fl_Color)g[(int)'U']);
  draw(LOWER_RIGHT, x+1, y, w-2, h, 1, (Fl_Color)g[(int)'W']);
  draw(CLOSED,	    x,   y, w,   h, 2, (Fl_Color)g[(int)'A']);
}